

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadapi_pthreads.c
# Opt level: O0

THREADAPI_RESULT ThreadAPI_Join(THREAD_HANDLE threadHandle,int *res)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  LOGGER_LOG l_1;
  void *threadResult;
  LOGGER_LOG l;
  THREAD_INSTANCE *threadInstance;
  int *piStack_20;
  THREADAPI_RESULT result;
  int *res_local;
  THREAD_HANDLE threadHandle_local;
  
  l = (LOGGER_LOG)threadHandle;
  piStack_20 = res;
  res_local = (int *)threadHandle;
  if (threadHandle == (THREAD_HANDLE)0x0) {
    threadInstance._4_4_ = THREADAPI_INVALID_ARG;
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      threadResult = p_Var2;
      pcVar3 = THREADAPI_RESULTStrings(threadInstance._4_4_);
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/adapters/threadapi_pthreads.c"
                ,"ThreadAPI_Join",0x61,1,"(result = %s%s (%d))","",pcVar3,threadInstance._4_4_);
    }
  }
  else {
    iVar1 = pthread_join(*threadHandle,&l_1);
    if (iVar1 == 0) {
      if (piStack_20 != (int *)0x0) {
        *piStack_20 = (int)l_1;
      }
      threadInstance._4_4_ = THREADAPI_OK;
    }
    else {
      threadInstance._4_4_ = THREADAPI_ERROR;
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar3 = THREADAPI_RESULTStrings(threadInstance._4_4_);
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/adapters/threadapi_pthreads.c"
                  ,"ThreadAPI_Join",0x69,1,"(result = %s%s (%d))","",pcVar3,threadInstance._4_4_);
      }
    }
    free(l);
  }
  return threadInstance._4_4_;
}

Assistant:

THREADAPI_RESULT ThreadAPI_Join(THREAD_HANDLE threadHandle, int* res)
{
    THREADAPI_RESULT result;

    THREAD_INSTANCE* threadInstance = (THREAD_INSTANCE*)threadHandle;
    if (threadInstance == NULL)
    {
        result = THREADAPI_INVALID_ARG;
        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(THREADAPI_RESULT, result));
    }
    else
    {
        void* threadResult;
        if (pthread_join(threadInstance->Pthread_handle, &threadResult) != 0)
        {
            result = THREADAPI_ERROR;
            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(THREADAPI_RESULT, result));
        }
        else
        {
            if (res != NULL)
            {
                *res = (int)(intptr_t)threadResult;
            }

            result = THREADAPI_OK;
        }

        free(threadInstance);
    }

    return result;
}